

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

uint __thiscall
glcts::TessellationShaderInvarianceRule7Test::getTestIterationIndex
          (TessellationShaderInvarianceRule7Test *this,bool is_triangles_iteration,
          float *inner_tess_levels,float *outer_tess_levels,
          _tessellation_shader_vertex_ordering vertex_ordering,uint n_modified_outer_tess_level)

{
  size_type sVar1;
  const_reference __src;
  float fVar2;
  _test_iterations *local_88;
  float local_74;
  float local_70;
  _test_iteration test_iteration;
  uint n_test_iteration;
  uint n_test_iterations;
  _test_iterations *test_iterations;
  uint result;
  float epsilon;
  uint n_modified_outer_tess_level_local;
  _tessellation_shader_vertex_ordering vertex_ordering_local;
  float *outer_tess_levels_local;
  float *inner_tess_levels_local;
  bool is_triangles_iteration_local;
  TessellationShaderInvarianceRule7Test *this_local;
  
  if (is_triangles_iteration) {
    local_88 = &this->m_test_triangles_iterations;
  }
  else {
    local_88 = &this->m_test_quads_iterations;
  }
  sVar1 = std::
          vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
          ::size(local_88);
  test_iteration.n_vertices = (uint)sVar1;
  test_iteration.n_modified_outer_tess_level = 0;
  while( true ) {
    if (test_iteration.n_vertices <= test_iteration.n_modified_outer_tess_level) {
      return 0xffffffff;
    }
    __src = std::
            vector<glcts::TessellationShaderInvarianceRule7Test::_test_iteration,_std::allocator<glcts::TessellationShaderInvarianceRule7Test::_test_iteration>_>
            ::operator[](local_88,(ulong)test_iteration.n_modified_outer_tess_level);
    memcpy(&local_74,__src,0x2c);
    fVar2 = de::abs<float>(local_74 - *inner_tess_levels);
    if (((((((fVar2 < 1e-05) &&
            (fVar2 = de::abs<float>(local_70 - inner_tess_levels[1]), fVar2 < 1e-05)) &&
           (test_iteration.outer_tess_levels[3] == (GLfloat)vertex_ordering)) &&
          (test_iteration.vertex_ordering == n_modified_outer_tess_level)) &&
         ((n_modified_outer_tess_level == 0 ||
          ((n_modified_outer_tess_level != 0 &&
           (fVar2 = de::abs<float>(test_iteration.inner_tess_levels[0] - *outer_tess_levels),
           fVar2 < 1e-05)))))) &&
        ((n_modified_outer_tess_level == 1 ||
         ((n_modified_outer_tess_level != 1 &&
          (fVar2 = de::abs<float>(test_iteration.inner_tess_levels[1] - outer_tess_levels[1]),
          fVar2 < 1e-05)))))) &&
       (((n_modified_outer_tess_level == 2 ||
         ((n_modified_outer_tess_level != 2 &&
          (fVar2 = de::abs<float>(test_iteration.outer_tess_levels[0] - outer_tess_levels[2]),
          fVar2 < 1e-05)))) &&
        ((n_modified_outer_tess_level == 3 ||
         ((n_modified_outer_tess_level != 3 &&
          (fVar2 = de::abs<float>(test_iteration.outer_tess_levels[1] - outer_tess_levels[3]),
          fVar2 < 1e-05)))))))) break;
    test_iteration.n_modified_outer_tess_level = test_iteration.n_modified_outer_tess_level + 1;
  }
  return test_iteration.n_modified_outer_tess_level;
}

Assistant:

unsigned int TessellationShaderInvarianceRule7Test::getTestIterationIndex(
	bool is_triangles_iteration, const float* inner_tess_levels, const float* outer_tess_levels,
	_tessellation_shader_vertex_ordering vertex_ordering, unsigned int n_modified_outer_tess_level)
{
	const float				epsilon = 1e-5f;
	unsigned int			result  = 0xFFFFFFFF;
	const _test_iterations& test_iterations =
		(is_triangles_iteration) ? m_test_triangles_iterations : m_test_quads_iterations;
	const unsigned int n_test_iterations = (const unsigned int)test_iterations.size();

	for (unsigned int n_test_iteration = 0; n_test_iteration < n_test_iterations; ++n_test_iteration)
	{
		_test_iteration test_iteration = test_iterations[n_test_iteration];

		if (de::abs(test_iteration.inner_tess_levels[0] - inner_tess_levels[0]) < epsilon &&
			de::abs(test_iteration.inner_tess_levels[1] - inner_tess_levels[1]) < epsilon &&
			test_iteration.vertex_ordering == vertex_ordering &&
			test_iteration.n_modified_outer_tess_level == n_modified_outer_tess_level)
		{
			/* Only compare outer tessellation levels that have not been modified */
			if (((n_modified_outer_tess_level == 0) ||
				 (n_modified_outer_tess_level != 0 &&
				  de::abs(test_iteration.outer_tess_levels[0] - outer_tess_levels[0]) < epsilon)) &&
				((n_modified_outer_tess_level == 1) ||
				 (n_modified_outer_tess_level != 1 &&
				  de::abs(test_iteration.outer_tess_levels[1] - outer_tess_levels[1]) < epsilon)) &&
				((n_modified_outer_tess_level == 2) ||
				 (n_modified_outer_tess_level != 2 &&
				  de::abs(test_iteration.outer_tess_levels[2] - outer_tess_levels[2]) < epsilon)) &&
				((n_modified_outer_tess_level == 3) ||
				 (n_modified_outer_tess_level != 3 &&
				  de::abs(test_iteration.outer_tess_levels[3] - outer_tess_levels[3]) < epsilon)))
			{
				result = n_test_iteration;

				break;
			}
		}
	} /* for (all test iterations) */

	return result;
}